

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O0

void OpalOperator_ComputeRates(OpalOperator *self)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  sbyte sVar5;
  uint16_t local_40;
  uint16_t local_3c;
  uint16_t local_34;
  uint16_t local_30;
  uint16_t local_28;
  uint16_t local_24;
  int rate_low;
  int rate_high;
  int combined_rate;
  OpalOperator *self_local;
  
  uVar1 = self->AttackRate;
  uVar2 = OpalChannel_GetKeyScaleNumber(self->Chan);
  sVar5 = 2;
  if (self->KeyScaleRate != 0) {
    sVar5 = 0;
  }
  uVar3 = (uint)uVar1 * 4 + ((int)(uint)uVar2 >> sVar5);
  iVar4 = (int)uVar3 >> 2;
  if (iVar4 < 0xc) {
    local_24 = 0xc - (short)iVar4;
  }
  else {
    local_24 = 0;
  }
  self->AttackShift = local_24;
  self->AttackMask = (short)(1 << ((byte)self->AttackShift & 0x1f)) - 1;
  if (iVar4 < 0xc) {
    local_28 = 1;
  }
  else {
    local_28 = (uint16_t)(1 << ((char)iVar4 - 0xcU & 0x1f));
  }
  self->AttackAdd = local_28;
  self->AttackTab = RateTables[(int)(uVar3 & 3)];
  if (self->AttackRate == 0xf) {
    self->AttackAdd = 0xfff;
  }
  uVar1 = self->DecayRate;
  uVar2 = OpalChannel_GetKeyScaleNumber(self->Chan);
  sVar5 = 2;
  if (self->KeyScaleRate != 0) {
    sVar5 = 0;
  }
  uVar3 = (uint)uVar1 * 4 + ((int)(uint)uVar2 >> sVar5);
  iVar4 = (int)uVar3 >> 2;
  if (iVar4 < 0xc) {
    local_30 = 0xc - (short)iVar4;
  }
  else {
    local_30 = 0;
  }
  self->DecayShift = local_30;
  self->DecayMask = (short)(1 << ((byte)self->DecayShift & 0x1f)) - 1;
  if (iVar4 < 0xc) {
    local_34 = 1;
  }
  else {
    local_34 = (uint16_t)(1 << ((char)iVar4 - 0xcU & 0x1f));
  }
  self->DecayAdd = local_34;
  self->DecayTab = RateTables[(int)(uVar3 & 3)];
  uVar1 = self->ReleaseRate;
  uVar2 = OpalChannel_GetKeyScaleNumber(self->Chan);
  sVar5 = 2;
  if (self->KeyScaleRate != 0) {
    sVar5 = 0;
  }
  uVar3 = (uint)uVar1 * 4 + ((int)(uint)uVar2 >> sVar5);
  iVar4 = (int)uVar3 >> 2;
  if (iVar4 < 0xc) {
    local_3c = 0xc - (short)iVar4;
  }
  else {
    local_3c = 0;
  }
  self->ReleaseShift = local_3c;
  self->ReleaseMask = (short)(1 << ((byte)self->ReleaseShift & 0x1f)) - 1;
  if (iVar4 < 0xc) {
    local_40 = 1;
  }
  else {
    local_40 = (uint16_t)(1 << ((char)iVar4 - 0xcU & 0x1f));
  }
  self->ReleaseAdd = local_40;
  self->ReleaseTab = RateTables[(int)(uVar3 & 3)];
  return;
}

Assistant:

static void OpalOperator_ComputeRates(OpalOperator *self)
{
    int combined_rate = self->AttackRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    int rate_high = combined_rate >> 2;
    int rate_low = combined_rate & 3;

    self->AttackShift = rate_high < 12 ? 12 - rate_high : 0;
    self->AttackMask = (1 << self->AttackShift) - 1;
    self->AttackAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->AttackTab = RateTables[rate_low];

    /* Attack rate of 15 is always instant */
    if(self->AttackRate == 15)
        self->AttackAdd = 0xFFF;

    combined_rate = self->DecayRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    rate_high = combined_rate >> 2;
    rate_low = combined_rate & 3;

    self->DecayShift = rate_high < 12 ? 12 - rate_high : 0;
    self->DecayMask = (1 << self->DecayShift) - 1;
    self->DecayAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->DecayTab = RateTables[rate_low];

    combined_rate = self->ReleaseRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    rate_high = combined_rate >> 2;
    rate_low = combined_rate & 3;

    self->ReleaseShift = rate_high < 12 ? 12 - rate_high : 0;
    self->ReleaseMask = (1 << self->ReleaseShift) - 1;
    self->ReleaseAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->ReleaseTab = RateTables[rate_low];
}